

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.cc
# Opt level: O0

string * __thiscall
testing::internal::StringFromGTestEnv_abi_cxx11_
          (string *__return_storage_ptr__,internal *this,char *flag,char *default_value)

{
  undefined8 uVar1;
  int iVar2;
  char *pcVar3;
  allocator local_82;
  allocator local_81;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  undefined4 local_5c;
  allocator local_55 [13];
  char *local_48;
  char *value;
  string env_var;
  char *default_value_local;
  char *flag_local;
  
  env_var.field_2._8_8_ = flag;
  FlagToEnvVar_abi_cxx11_((string *)&value,this,flag);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  pcVar3 = posix::GetEnv(pcVar3);
  local_48 = pcVar3;
  if (pcVar3 == (char *)0x0) {
    iVar2 = strcmp((char *)this,"output");
    if ((iVar2 == 0) && (local_48 = posix::GetEnv("XML_OUTPUT_FILE"), local_48 != (char *)0x0)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_80,"xml:",&local_81);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     __return_storage_ptr__,&local_80,local_48);
      std::__cxx11::string::~string((string *)&local_80);
      std::allocator<char>::~allocator((allocator<char> *)&local_81);
    }
    else {
      uVar1 = env_var.field_2._8_8_;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)__return_storage_ptr__,(char *)uVar1,&local_82);
      std::allocator<char>::~allocator((allocator<char> *)&local_82);
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar3,local_55);
    std::allocator<char>::~allocator((allocator<char> *)local_55);
  }
  local_5c = 1;
  std::__cxx11::string::~string((string *)&value);
  return __return_storage_ptr__;
}

Assistant:

std::string StringFromGTestEnv(const char* flag, const char* default_value) {
#if defined(GTEST_GET_STRING_FROM_ENV_)
  return GTEST_GET_STRING_FROM_ENV_(flag, default_value);
#endif  // defined(GTEST_GET_STRING_FROM_ENV_)
  const std::string env_var = FlagToEnvVar(flag);
  const char* value = posix::GetEnv(env_var.c_str());
  if (value != NULL) {
    return value;
  }

  // As a special case for the 'output' flag, if GTEST_OUTPUT is not
  // set, we look for XML_OUTPUT_FILE, which is set by the Bazel build
  // system.  The value of XML_OUTPUT_FILE is a filename without the
  // "xml:" prefix of GTEST_OUTPUT.
  //
  // The net priority order after flag processing is thus:
  //   --gtest_output command line flag
  //   GTEST_OUTPUT environment variable
  //   XML_OUTPUT_FILE environment variable
  //   'default_value'
  if (strcmp(flag, "output") == 0) {
    value = posix::GetEnv("XML_OUTPUT_FILE");
    if (value != NULL) {
      return std::string("xml:") + value;
    }
  }
  return default_value;
}